

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68 [3];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator iter;
  String *comment;
  Value *root_local;
  BuiltStyledStreamWriter *this_local;
  
  if ((this->cs_ != None) && (bVar2 = Value::hasComment(root,commentBefore), bVar2)) {
    if (((byte)this->field_0xd8 >> 1 & 1) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_((String *)&iter,root,commentBefore);
    local_48._M_current = (char *)std::__cxx11::string::begin();
    while( true ) {
      local_50._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
      if (!bVar2) break;
      poVar1 = (this->super_StreamWriter).sout_;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      std::operator<<(poVar1,*pcVar4);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_48);
      bVar2 = false;
      if (*pcVar4 == '\n') {
        local_68[0] = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_48,1);
        local_70._M_current = (char *)std::__cxx11::string::end();
        bVar3 = __gnu_cxx::operator!=(local_68,&local_70);
        bVar2 = false;
        if (bVar3) {
          local_78 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(&local_48,1);
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          bVar2 = *pcVar4 == '/';
        }
      }
      if (bVar2) {
        std::operator<<((this->super_StreamWriter).sout_,(string *)&this->indentString_);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_48);
    }
    this->field_0xd8 = this->field_0xd8 & 0xfd;
    std::__cxx11::string::~string((string *)&iter);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_)
    writeIndent();
  const String& comment = root.getComment(commentBefore);
  String::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' && ((iter + 1) != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}